

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O3

void __thiscall OStream_LargeSpan_Test::~OStream_LargeSpan_Test(OStream_LargeSpan_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (OStream, LargeSpan) {
    std::array<char const, 7U> const v{{'a', 'b', 'c', 'd', 'e', 'f', 'g'}};

    test_ostream str;

    // TODO: here the code could optimize the case where more than a buffer's worth of data is
    // being written.
    testing::InSequence seq;
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"abc"s}), test_ostream::buffer_size));
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"def"s}), test_ostream::buffer_size));
    EXPECT_CALL (str, flush_buffer (testing::Truly (first_elements_are{"g"s}), std::size_t{1}));

    str.write (pstore::gsl::make_span (v));
    str.flush ();
}